

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void wabt::WriteType(Stream *stream,Type type,char *desc)

{
  Index value;
  Type local_70;
  string local_68;
  string local_48;
  
  local_70 = type;
  if (desc == (char *)0x0) {
    Type::GetName_abi_cxx11_(&local_48,&local_70);
    WriteS32Leb128(stream,type.enum_,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    WriteS32Leb128(stream,type.enum_,desc);
  }
  if (local_70.enum_ == Reference) {
    value = local_70.type_index_;
    if (desc == (char *)0x0) {
      Type::GetName_abi_cxx11_(&local_68,&local_70);
      WriteS32Leb128(stream,value,local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      WriteS32Leb128(stream,local_70.type_index_,desc);
    }
  }
  return;
}

Assistant:

void WriteType(Stream* stream, Type type, const char* desc) {
  WriteS32Leb128(stream, type, desc ? desc : type.GetName().c_str());
  if (type.IsReferenceWithIndex()) {
    WriteS32Leb128(stream, type.GetReferenceIndex(),
                   desc ? desc : type.GetName().c_str());
  }
}